

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

void __thiscall Lexer_Integers_Test::~Lexer_Integers_Test(Lexer_Integers_Test *this)

{
  Lexer_Integers_Test *this_local;
  
  ~Lexer_Integers_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Lexer, Integers) {
	MockLexer mock = mock_new("3 0 1503 19993");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 0.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 1503.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 19993.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}